

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_suite.hpp
# Opt level: O3

test_suite * init_unit_test_suite(int param_1,char **param_2)

{
  return (test_suite *)0x0;
}

Assistant:

::boost::unit_test::test_suite*
init_unit_test_suite( int, char* [] )   {
#endif

#ifdef BOOST_TEST_MODULE
    using namespace ::boost::unit_test;
    assign_op( framework::master_test_suite().p_name.value, BOOST_TEST_STRINGIZE( BOOST_TEST_MODULE ).trim( "\"" ), 0 );

#endif

#ifdef BOOST_TEST_ALTERNATIVE_INIT_API
    return true;
}